

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O2

uint32_t FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::tryB
                   (uint32_t b,uint32_t *in,uint32_t len)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (b != 0x20) {
    uVar1 = 0;
    for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = (uVar1 + 1) - (uint)(in[uVar2] >> ((ulong)b & 0x3f) == 0);
    }
  }
  return uVar1;
}

Assistant:

__attribute__((pure)) uint32_t
SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::tryB(
    uint32_t b, const uint32_t *in, uint32_t len) {
  uint32_t i;
  uint32_t curExcept;

  assert(b <= 32);

  if (b == 32)
    return 0;

  for (i = 0, curExcept = 0; i < len; i++) {
    if (in[i] >= (1ULL << b))
      curExcept++;
  }

  return curExcept;
}